

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O2

UBool uloc_isRightToLeft_63(char *locale)

{
  UBool UVar1;
  int32_t iVar2;
  UScriptCode script_00;
  char *pcVar3;
  UErrorCode errorCode;
  char script [8];
  char lang [8];
  char likely [157];
  
  errorCode = U_ZERO_ERROR;
  iVar2 = uloc_getScript_63(locale,script,8,&errorCode);
  if (((errorCode < U_ILLEGAL_ARGUMENT_ERROR) && (errorCode != U_STRING_NOT_TERMINATED_WARNING)) &&
     (iVar2 != 0)) {
LAB_002831f7:
    script_00 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,script);
    UVar1 = uscript_isRightToLeft_63(script_00);
  }
  else {
    errorCode = U_ZERO_ERROR;
    iVar2 = uloc_getLanguage_63(locale,lang,8,&errorCode);
    if ((iVar2 != 0 && errorCode != U_STRING_NOT_TERMINATED_WARNING) &&
        errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pcVar3 = strstr("root-en-es-pt-zh-ja-ko-de-fr-it-ar+he+fa+ru-nl-pl-th-tr-",lang);
      if (pcVar3 != (char *)0x0) {
        if (pcVar3[iVar2] == '-') goto LAB_002832a4;
        if (pcVar3[iVar2] == '+') {
          return '\x01';
        }
      }
      errorCode = U_ZERO_ERROR;
      uloc_addLikelySubtags_63(locale,likely,0x9d,&errorCode);
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR && errorCode != U_STRING_NOT_TERMINATED_WARNING) {
        iVar2 = uloc_getScript_63(likely,script,8,&errorCode);
        if (U_ZERO_ERROR < errorCode) {
          return '\0';
        }
        if (errorCode == U_STRING_NOT_TERMINATED_WARNING) {
          return '\0';
        }
        if (iVar2 == 0) {
          return '\0';
        }
        goto LAB_002831f7;
      }
    }
LAB_002832a4:
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

U_CAPI UBool U_EXPORT2
uloc_isRightToLeft(const char *locale) {
    UErrorCode errorCode = U_ZERO_ERROR;
    char script[8];
    int32_t scriptLength = uloc_getScript(locale, script, UPRV_LENGTHOF(script), &errorCode);
    if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING ||
            scriptLength == 0) {
        // Fastpath: We know the likely scripts and their writing direction
        // for some common languages.
        errorCode = U_ZERO_ERROR;
        char lang[8];
        int32_t langLength = uloc_getLanguage(locale, lang, UPRV_LENGTHOF(lang), &errorCode);
        if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING ||
                langLength == 0) {
            return FALSE;
        }
        const char* langPtr = uprv_strstr(LANG_DIR_STRING, lang);
        if (langPtr != NULL) {
            switch (langPtr[langLength]) {
            case '-': return FALSE;
            case '+': return TRUE;
            default: break;  // partial match of a longer code
            }
        }
        // Otherwise, find the likely script.
        errorCode = U_ZERO_ERROR;
        char likely[ULOC_FULLNAME_CAPACITY];
        (void)uloc_addLikelySubtags(locale, likely, UPRV_LENGTHOF(likely), &errorCode);
        if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING) {
            return FALSE;
        }
        scriptLength = uloc_getScript(likely, script, UPRV_LENGTHOF(script), &errorCode);
        if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING ||
                scriptLength == 0) {
            return FALSE;
        }
    }
    UScriptCode scriptCode = (UScriptCode)u_getPropertyValueEnum(UCHAR_SCRIPT, script);
    return uscript_isRightToLeft(scriptCode);
}